

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O2

bool __thiscall SQVM::TailCall(SQVM *this,SQClosure *closure,SQInteger parambase,SQInteger nparams)

{
  SQUnsignedInteger *pSVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  SQObjectPtr *this_00;
  long lVar5;
  SQObjectPtr clo;
  
  lVar2 = this->_top;
  clo.super_SQObject._type = OT_CLOSURE;
  pSVar1 = &(closure->super_SQCollectable).super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  clo.super_SQObject._unVal.pClosure = closure;
  if (this->ci->_root == 0) {
    lVar4 = 0;
    lVar5 = 0;
    if (0 < nparams) {
      lVar5 = nparams;
    }
    while (lVar5 != 0) {
      this_00 = (SQObjectPtr *)
                ((long)&(this->_stack)._vals[this->_stackbase].super_SQObject._type + lVar4);
      SQObjectPtr::operator=(this_00,this_00 + parambase);
      lVar4 = lVar4 + 0x10;
      lVar5 = lVar5 + -1;
    }
    bVar3 = StartCall(this,closure,(long)this->ci->_target,nparams,this->_stackbase,true);
    if (this->_top <= lVar2) {
      this->_top = lVar2;
    }
  }
  else {
    bVar3 = false;
    Raise_Error(this,"root calls cannot invoke tailcalls");
  }
  SQObjectPtr::~SQObjectPtr(&clo);
  return bVar3;
}

Assistant:

bool SQVM::TailCall(SQClosure *closure, SQInteger parambase,SQInteger nparams)
{
	SQInteger last_top = _top;
	SQObjectPtr clo = closure;
	if (ci->_root)
	{
		Raise_Error("root calls cannot invoke tailcalls");
		return false;
	}
	for (SQInteger i = 0; i < nparams; i++) STK(i) = STK(parambase + i);
	bool ret = StartCall(closure, ci->_target, nparams, _stackbase, true);
	if (last_top >= _top) {
		_top = last_top;
	}
	return ret;
}